

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxVariant.cpp
# Opt level: O3

void __thiscall Jinx::Variant::SetString(Variant *this,String *value)

{
  Destroy(this);
  this->m_type = String;
  (this->field_1).m_collection.
  super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)((long)&this->field_1 + 0x10);
  (this->field_1).m_string._M_string_length = 0;
  *(undefined1 *)((long)&this->field_1 + 0x10) = 0;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::_M_assign
            (&(this->field_1).m_string,value);
  return;
}

Assistant:

inline_t void Variant::SetString(const String & value)
	{
		Destroy();
		m_type = ValueType::String;
		new(&m_string) String();
		m_string = value;
	}